

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

void service_start(service *svc,char *dynamic_args)

{
  char **__argv;
  uint uVar1;
  int iVar2;
  __pid_t _Var3;
  uint __fd;
  time_t tVar4;
  char *pcVar5;
  int *piVar6;
  socketinfo *psVar7;
  char *pcVar8;
  svcenvinfo *psVar9;
  long lVar10;
  char *next;
  char key [64];
  stat s;
  
  uVar1 = svc->flags;
  svc->flags = uVar1 & 0xfffffff6;
  svc->time_started = 0;
  if ((uVar1 & 4) != 0) {
    return;
  }
  if (((uVar1 & 0x10) == 0) || ((have_console & 1) != 0)) {
    iVar2 = stat(svc->args[0],(stat *)&s);
    if (iVar2 != 0) {
      log_write(3,"<3>init: cannot find \'%s\', disabling \'%s\'\n",svc->args[0],svc->name);
      goto LAB_00105296;
    }
    if ((dynamic_args == (char *)0x0) || ((svc->flags & 2) != 0)) {
      log_write(5,"<5>init: starting \'%s\'\n",svc->name);
      _Var3 = fork();
      if (_Var3 != 0) {
        if (_Var3 < 0) {
          log_write(3,"<3>init: failed to start \'%s\'\n",svc->name);
          svc->pid = 0;
          return;
        }
        tVar4 = gettime();
        svc->time_started = tVar4;
        svc->pid = _Var3;
        *(byte *)&svc->flags = (byte)svc->flags | 4;
        notify_service_state(svc->name,"running");
        return;
      }
      __argv = svc->args;
      psVar9 = (svcenvinfo *)&svc->envvars;
      while (psVar9 = psVar9->next, psVar9 != (svcenvinfo *)0x0) {
        add_environment(psVar9->name,psVar9->value);
      }
      psVar7 = (socketinfo *)&svc->sockets;
      while (psVar7 = psVar7->next, psVar7 != (socketinfo *)0x0) {
        pcVar5 = psVar7->name;
        iVar2 = strcmp(psVar7->type,"dgram");
        __fd = create_socket(pcVar5,(iVar2 == 0) + 1,psVar7->perm,psVar7->uid,psVar7->gid);
        if (-1 < (int)__fd) {
          key[0x30] = '\0';
          key[0x31] = '\0';
          key[0x32] = '\0';
          key[0x33] = '\0';
          key[0x34] = '\0';
          key[0x35] = '\0';
          key[0x36] = '\0';
          key[0x37] = '\0';
          key[0x38] = '\0';
          key[0x39] = '\0';
          key[0x3a] = '\0';
          key[0x3b] = '\0';
          key[0x3c] = '\0';
          key[0x3d] = '\0';
          key[0x3e] = '\0';
          key[0x3f] = '\0';
          key[0x20] = '\0';
          key[0x21] = '\0';
          key[0x22] = '\0';
          key[0x23] = '\0';
          key[0x24] = '\0';
          key[0x25] = '\0';
          key[0x26] = '\0';
          key[0x27] = '\0';
          key[0x28] = '\0';
          key[0x29] = '\0';
          key[0x2a] = '\0';
          key[0x2b] = '\0';
          key[0x2c] = '\0';
          key[0x2d] = '\0';
          key[0x2e] = '\0';
          key[0x2f] = '\0';
          key[0x10] = '\0';
          key[0x11] = '\0';
          key[0x12] = '\0';
          key[0x13] = '\0';
          key[0x14] = '\0';
          key[0x15] = '\0';
          key[0x16] = '\0';
          key[0x17] = '\0';
          key[0x18] = '\0';
          key[0x19] = '\0';
          key[0x1a] = '\0';
          key[0x1b] = '\0';
          key[0x1c] = '\0';
          key[0x1d] = '\0';
          key[0x1e] = '\0';
          key[0x1f] = '\0';
          builtin_strncpy(key,"ANDROID_SOCKET_",0x10);
          strlcpy(key + 0xf,psVar7->name,0x30);
          snprintf((char *)&next,0x40,"%d",(ulong)__fd);
          add_environment(key,(char *)&next);
          fcntl(__fd,2,0);
        }
      }
      if ((uVar1 & 0x10) == 0) {
        iVar2 = open("/dev/null",2);
        dup2(iVar2,0);
        dup2(iVar2,1);
        dup2(iVar2,2);
        close(iVar2);
      }
      else {
        setsid();
      }
      _Var3 = getpid();
      setpgid(0,_Var3);
      if (svc->gid != 0) {
        setgid(svc->gid);
      }
      if (svc->nr_supp_gids != 0) {
        setgroups(svc->nr_supp_gids,svc->supp_gids);
      }
      if (svc->uid != 0) {
        setuid(svc->uid);
      }
      if (dynamic_args == (char *)0x0) {
        iVar2 = execve(*__argv,__argv,ENV);
        if (iVar2 < 0) {
          pcVar5 = *__argv;
          piVar6 = __errno_location();
          pcVar8 = strerror(*piVar6);
          log_write(3,"<3>init: cannot execve(\'%s\'): %s\n",pcVar5,pcVar8);
        }
      }
      else {
        lVar10 = (long)svc->nargs;
        next = strdup(dynamic_args);
        memcpy(key,__argv,lVar10 * 8);
        do {
          pcVar5 = strsep(&next," ");
          if (pcVar5 == (char *)0x0) goto LAB_00105508;
          *(char **)(key + lVar10 * 8) = pcVar5;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x40);
        lVar10 = 0x40;
LAB_00105508:
        pcVar5 = key + (long)(int)lVar10 * 8;
        pcVar5[0] = '\0';
        pcVar5[1] = '\0';
        pcVar5[2] = '\0';
        pcVar5[3] = '\0';
        pcVar5[4] = '\0';
        pcVar5[5] = '\0';
        pcVar5[6] = '\0';
        pcVar5[7] = '\0';
        execve(*__argv,(char **)key,ENV);
      }
      _exit(0x7f);
    }
    pcVar5 = svc->args[0];
    pcVar8 = "<3>init: service \'%s\' must be one-shot to use dynamic args, disabling\n";
  }
  else {
    pcVar5 = svc->name;
    pcVar8 = "<3>init: service \'%s\' requires console\n";
  }
  log_write(3,pcVar8,pcVar5);
LAB_00105296:
  *(byte *)&svc->flags = (byte)svc->flags | 1;
  return;
}

Assistant:

void service_start(struct service *svc, const char *dynamic_args)
{
    struct stat s;
    pid_t pid;
    int needs_console;
    int n;

        /* starting a service removes it from the disabled
         * state and immediately takes it out of the restarting
         * state if it was in there
         */
    svc->flags &= (~(SVC_DISABLED|SVC_RESTARTING));
    svc->time_started = 0;
    
        /* running processes require no additional work -- if
         * they're in the process of exiting, we've ensured
         * that they will immediately restart on exit, unless
         * they are ONESHOT
         */
    if (svc->flags & SVC_RUNNING) {
        return;
    }

    needs_console = (svc->flags & SVC_CONSOLE) ? 1 : 0;
    if (needs_console && (!have_console)) {
        ERROR("service '%s' requires console\n", svc->name);
        svc->flags |= SVC_DISABLED;
        return;
    }

    if (stat(svc->args[0], &s) != 0) {
        ERROR("cannot find '%s', disabling '%s'\n", svc->args[0], svc->name);
        svc->flags |= SVC_DISABLED;
        return;
    }

    if ((!(svc->flags & SVC_ONESHOT)) && dynamic_args) {
        ERROR("service '%s' must be one-shot to use dynamic args, disabling\n",
               svc->args[0]);
        svc->flags |= SVC_DISABLED;
        return;
    }

    NOTICE("starting '%s'\n", svc->name);

    pid = fork();

    if (pid == 0) {
        struct socketinfo *si;
        struct svcenvinfo *ei;
        char tmp[32];
        int fd, sz;

        for (ei = svc->envvars; ei; ei = ei->next)
            add_environment(ei->name, ei->value);

        for (si = svc->sockets; si; si = si->next) {
            int s = create_socket(si->name,
                                  !strcmp(si->type, "dgram") ? 
                                  SOCK_DGRAM : SOCK_STREAM,
                                  si->perm, si->uid, si->gid);
            if (s >= 0) {
                publish_socket(si->name, s);
            }
        }

        if (needs_console) {
            setsid();
//            open_console();
        } else {
            zap_stdio();
        }

#if 0
        for (n = 0; svc->args[n]; n++) {
            INFO("args[%d] = '%s'\n", n, svc->args[n]);
        }
        for (n = 0; ENV[n]; n++) {
            INFO("env[%d] = '%s'\n", n, ENV[n]);
        }
#endif

        setpgid(0, getpid());

    /* as requested, set our gid, supplemental gids, and uid */
        if (svc->gid) {
            setgid(svc->gid);
        }
        if (svc->nr_supp_gids) {
            setgroups(svc->nr_supp_gids, svc->supp_gids);
        }
        if (svc->uid) {
            setuid(svc->uid);
        }

        if (!dynamic_args) {
            if (execve(svc->args[0], (char**) svc->args, (char**) ENV) < 0) {
                ERROR("cannot execve('%s'): %s\n", svc->args[0], strerror(errno));
            }
        } else {
            char *arg_ptrs[SVC_MAXARGS+1];
            int arg_idx = svc->nargs;
            char *tmp = strdup(dynamic_args);
            char *next = tmp;
            char *bword;

            /* Copy the static arguments */
            memcpy(arg_ptrs, svc->args, (svc->nargs * sizeof(char *)));

            while((bword = strsep(&next, " "))) {
                arg_ptrs[arg_idx++] = bword;
                if (arg_idx == SVC_MAXARGS)
                    break;
            }
            arg_ptrs[arg_idx] = '\0';
            execve(svc->args[0], (char**) arg_ptrs, (char**) ENV);
        }
        _exit(127);
    }

    if (pid < 0) {
        ERROR("failed to start '%s'\n", svc->name);
        svc->pid = 0;
        return;
    }

    svc->time_started = gettime();
    svc->pid = pid;
    svc->flags |= SVC_RUNNING;

    notify_service_state(svc->name, "running");
}